

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# Deque.hpp
# Opt level: O1

void __thiscall Lib::Deque<Kernel::Clause_*>::expand(Deque<Kernel::Clause_*> *this)

{
  Clause **ppCVar1;
  size_t sVar2;
  Clause **ppCVar3;
  Clause **ppCVar4;
  size_t sVar5;
  long lVar6;
  long lVar7;
  ulong uVar8;
  
  sVar2 = this->_capacity;
  ppCVar4 = this->_front;
  sVar5 = 0;
  if (this->_back < ppCVar4) {
    sVar5 = sVar2;
  }
  ppCVar1 = this->_back + sVar5;
  uVar8 = sVar2 * 0x10;
  if (uVar8 == 0) {
    ppCVar3 = (Clause **)
              FixedSizeAllocator<8UL>::alloc
                        ((FixedSizeAllocator<8UL> *)GLOBAL_SMALL_OBJECT_ALLOCATOR);
  }
  else if (uVar8 < 0x11) {
    ppCVar3 = (Clause **)
              FixedSizeAllocator<16UL>::alloc
                        ((FixedSizeAllocator<16UL> *)(GLOBAL_SMALL_OBJECT_ALLOCATOR + 0x18));
  }
  else if (uVar8 < 0x19) {
    ppCVar3 = (Clause **)
              FixedSizeAllocator<24UL>::alloc
                        ((FixedSizeAllocator<24UL> *)(GLOBAL_SMALL_OBJECT_ALLOCATOR + 0x30));
  }
  else if (uVar8 < 0x21) {
    ppCVar3 = (Clause **)
              FixedSizeAllocator<32UL>::alloc
                        ((FixedSizeAllocator<32UL> *)(GLOBAL_SMALL_OBJECT_ALLOCATOR + 0x48));
  }
  else if (uVar8 < 0x31) {
    ppCVar3 = (Clause **)
              FixedSizeAllocator<48UL>::alloc
                        ((FixedSizeAllocator<48UL> *)(GLOBAL_SMALL_OBJECT_ALLOCATOR + 0x60));
  }
  else if (uVar8 < 0x41) {
    ppCVar3 = (Clause **)
              FixedSizeAllocator<64UL>::alloc
                        ((FixedSizeAllocator<64UL> *)(GLOBAL_SMALL_OBJECT_ALLOCATOR + 0x78));
  }
  else {
    ppCVar3 = (Clause **)::operator_new(uVar8,0x10);
  }
  lVar7 = (long)ppCVar1 - (long)ppCVar4 >> 3;
  if (ppCVar1 != ppCVar4) {
    ppCVar4 = this->_front;
    lVar6 = 0;
    do {
      ppCVar3[lVar6] = *ppCVar4;
      ppCVar4 = ppCVar4 + 1;
      if (ppCVar4 == this->_end) {
        ppCVar4 = this->_data;
      }
      lVar6 = lVar6 + 1;
    } while (lVar7 + (ulong)(lVar7 == 0) != lVar6);
  }
  ppCVar4 = this->_data;
  if (ppCVar4 != (Clause **)0x0) {
    uVar8 = this->_capacity * 8 + 0xf & 0xfffffffffffffff0;
    if (uVar8 == 0) {
      *ppCVar4 = (Clause *)GLOBAL_SMALL_OBJECT_ALLOCATOR._16_8_;
      GLOBAL_SMALL_OBJECT_ALLOCATOR._16_8_ = ppCVar4;
    }
    else if (uVar8 < 0x11) {
      *ppCVar4 = (Clause *)GLOBAL_SMALL_OBJECT_ALLOCATOR._40_8_;
      GLOBAL_SMALL_OBJECT_ALLOCATOR._40_8_ = ppCVar4;
    }
    else if (uVar8 < 0x19) {
      *ppCVar4 = (Clause *)GLOBAL_SMALL_OBJECT_ALLOCATOR._64_8_;
      GLOBAL_SMALL_OBJECT_ALLOCATOR._64_8_ = ppCVar4;
    }
    else if (uVar8 < 0x21) {
      *ppCVar4 = (Clause *)GLOBAL_SMALL_OBJECT_ALLOCATOR._88_8_;
      GLOBAL_SMALL_OBJECT_ALLOCATOR._88_8_ = ppCVar4;
    }
    else if (uVar8 < 0x31) {
      *ppCVar4 = (Clause *)GLOBAL_SMALL_OBJECT_ALLOCATOR._112_8_;
      GLOBAL_SMALL_OBJECT_ALLOCATOR._112_8_ = ppCVar4;
    }
    else if (uVar8 < 0x41) {
      *ppCVar4 = (Clause *)GLOBAL_SMALL_OBJECT_ALLOCATOR._136_8_;
      GLOBAL_SMALL_OBJECT_ALLOCATOR._136_8_ = ppCVar4;
    }
    else {
      operator_delete(ppCVar4,0x10);
    }
  }
  this->_data = ppCVar3;
  this->_front = ppCVar3;
  this->_back = ppCVar3 + lVar7;
  this->_end = ppCVar3 + sVar2 * 2;
  this->_capacity = sVar2 * 2;
  return;
}

Assistant:

void expand ()
  {
    ASS(shouldExpand());

    size_t curSize=size();
    size_t newCapacity = 2 * _capacity;

    // allocate new stack and copy old stack's content to the new place
    void* mem = ALLOC_KNOWN(newCapacity*sizeof(C),"Deque<>");

    C* newData = static_cast<C*>(mem);
    C* oldPtr=_front;
    for(size_t i = 0; i<curSize; i++) {
      ::new (newData+i) C(*oldPtr);
      oldPtr->~C();

      oldPtr++;
      if(oldPtr==_end) {
	oldPtr=_data;
      }
    }
    ASS_EQ(oldPtr, _back);
    // deallocate the old stack
    DEALLOC_KNOWN(_data,_capacity*sizeof(C),"Deque<>");

    _data = newData;
    _front = _data;
    _back = _data + curSize;
    _end = _data + newCapacity;
    _capacity = newCapacity;
  }